

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# math.cpp
# Opt level: O1

int __thiscall pbrt::NextPrime(pbrt *this,int x)

{
  undefined1 auVar1 [16];
  iterator __end2;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  bool bVar5;
  undefined8 in_XMM0_Qa;
  double dVar6;
  undefined1 auVar7 [16];
  undefined1 in_XMM2 [16];
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> smallPrimes;
  uint local_50;
  allocator_type local_49;
  double local_48;
  vector<int,_std::allocator<int>_> local_40;
  double local_28;
  
  uVar3 = 3;
  if ((uint)this != 2) {
    uVar2 = (uint)this | 1;
    local_50 = 2;
    __l._M_len = 1;
    __l._M_array = (iterator)&local_50;
    std::vector<int,_std::allocator<int>_>::vector(&local_40,__l,&local_49);
    auVar7._0_8_ = (double)(int)(uVar2 + 0x140);
    auVar7._8_8_ = in_XMM0_Qa;
    local_50 = 3;
    local_48 = auVar7._0_8_;
    if (auVar7._0_8_ < 0.0) {
      dVar6 = sqrt(auVar7._0_8_);
    }
    else {
      auVar7 = vsqrtsd_avx(auVar7,auVar7);
      dVar6 = auVar7._0_8_;
    }
    if (2 < (int)dVar6) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = local_48;
      auVar7 = vsqrtsd_avx(in_XMM2,auVar1);
      local_28 = auVar7._0_8_;
      puVar4 = (uint *)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
      do {
        for (; (puVar4 != (uint *)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish &&
               ((*puVar4 == local_50 || ((int)local_50 % (int)*puVar4 != 0)))); puVar4 = puVar4 + 1)
        {
        }
        if (puVar4 == (uint *)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish) {
          if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish ==
              local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_end_of_storage) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_40,
                       (iterator)
                       local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_finish,(int *)&local_50);
          }
          else {
            *local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish = local_50;
            local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_finish + 1;
          }
        }
        uVar3 = local_50 + 2;
        dVar6 = local_28;
        local_50 = uVar3;
        if (local_48 < 0.0) {
          dVar6 = sqrt(local_48);
        }
        puVar4 = (uint *)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start;
      } while ((int)uVar3 <= (int)dVar6);
    }
    do {
      uVar3 = uVar2;
      puVar4 = (uint *)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
      bVar5 = local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start ==
              local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_finish;
      if (local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start !=
          local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish) {
        do {
          if ((*puVar4 != uVar3) && ((int)uVar3 % (int)*puVar4 == 0)) break;
          bVar5 = puVar4 + 1 ==
                  (uint *)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish;
          puVar4 = puVar4 + 1;
        } while (!bVar5);
      }
      uVar2 = uVar3 + 2;
    } while (!bVar5);
    if ((uint *)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (uint *)0x0) {
      operator_delete(local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_40.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  return uVar3;
}

Assistant:

int NextPrime(int x) {
    if (x == 2)
        return 3;
    if ((x & 1) == 0)
        ++x;  // make it odd

    std::vector<int> smallPrimes{2};
    // NOTE: isPrime w.r.t. smallPrims...
    auto isPrime = [&smallPrimes](int n) {
        for (int p : smallPrimes)
            if (n != p && (n % p) == 0)
                return false;
        return true;
    };

    // Initialize smallPrimes
    // Up to about 2B, the biggest gap between primes:
    // https://en.wikipedia.org/wiki/Prime_gap
    const int maxPrimeGap = 320;
    for (int n = 3; n < int(std::sqrt(x + maxPrimeGap)) + 1; n += 2)
        if (isPrime(n))
            smallPrimes.push_back(n);

    while (!isPrime(x))
        x += 2;

    return x;
}